

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::Directory,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::copyDirectory
          (Impl *this,Directory *other,bool copyFiles)

{
  Type TVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  InMemoryFileFactory *pIVar4;
  undefined8 uVar5;
  ArrayDisposer *pAVar6;
  char in_CL;
  undefined7 in_register_00000011;
  long *plVar7;
  Directory *extraout_RDX;
  Entry *pEVar8;
  char *in_R8;
  long lVar9;
  size_t sVar10;
  Disposer *pDVar11;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var12;
  Own<const_kj::Directory,_std::nullptr_t> OVar13;
  String argValues [1];
  Own<const_kj::File,_std::nullptr_t> copy;
  EntryImpl EStack_178;
  EntryImpl entry;
  Fault f;
  Path filename;
  Array<kj::ReadableDirectory::Entry> local_90;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  newNode;
  char *local_50;
  undefined8 local_48;
  ArrayPtr<const_char> local_40;
  
  plVar7 = (long *)CONCAT71(in_register_00000011,copyFiles);
  pp_Var2 = (other->super_ReadableDirectory).super_FsNode._vptr_FsNode;
  pp_Var3 = other[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
  pIVar4 = (InMemoryFileFactory *)operator_new(0x78);
  *(undefined4 *)(pIVar4 + 0x10) = 0;
  *(undefined ***)pIVar4 = &PTR_getFd_00278ff8;
  *(undefined ***)(pIVar4 + 8) = &PTR_disposeImpl_002790d0;
  kj::_::Mutex::Mutex((Mutex *)(pIVar4 + 0x18));
  *(_func_int ***)(pIVar4 + 0x30) = pp_Var2;
  *(_func_int ***)(pIVar4 + 0x38) = pp_Var3;
  *(undefined4 *)(pIVar4 + 0x48) = 0;
  *(undefined8 *)(pIVar4 + 0x50) = 0;
  *(InMemoryFileFactory **)(pIVar4 + 0x58) = pIVar4 + 0x48;
  *(InMemoryFileFactory **)(pIVar4 + 0x60) = pIVar4 + 0x48;
  *(undefined8 *)(pIVar4 + 0x68) = 0;
  uVar5 = (**(code **)*pp_Var2)(pp_Var2);
  *(undefined8 *)(pIVar4 + 0x70) = uVar5;
  (**(code **)(*plVar7 + 0x38))(&local_90,plVar7);
  lVar9 = local_90.size_ << 5;
  pEVar8 = local_90.ptr;
  do {
    if (lVar9 == 0) {
      Array<kj::ReadableDirectory::Entry>::~Array(&local_90);
      LOCK();
      *(int *)(pIVar4 + 0x10) = *(int *)(pIVar4 + 0x10) + 1;
      UNLOCK();
      this->clock = (Clock *)(pIVar4 + 8);
      this->fileFactory = pIVar4;
      copy.ptr = (File *)0x0;
      copy.disposer = (Disposer *)(pIVar4 + 8);
      Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> *)&copy);
      OVar13.ptr = extraout_RDX;
      OVar13.disposer = (Disposer *)this;
      return OVar13;
    }
    Path::Path(&filename,&pEVar8->name);
    newNode.tag = 0;
    TVar1 = pEVar8->type;
    if (TVar1 == FILE) {
      in_R8 = (char *)0x2;
      (**(code **)(*plVar7 + 0x68))
                ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)&copy,plVar7,filename.parts.ptr,filename.parts.size_);
      entry.name.content.ptr = (char *)copy.disposer;
      entry.name.content.size_ = (size_t)copy.ptr;
      copy.ptr = (File *)0x0;
      Own<const_kj::File,_std::nullptr_t>::dispose(&copy);
      sVar10 = entry.name.content.size_;
      if (entry.name.content.size_ != 0) {
        pAVar6 = (ArrayDisposer *)entry.name.content.size_;
        if (in_CL != '\0') {
          (**(code **)**(undefined8 **)(pIVar4 + 0x38))
                    (&copy,*(undefined8 **)(pIVar4 + 0x38),*(undefined8 *)(pIVar4 + 0x30));
          in_R8 = (char *)0xffffffffffffffff;
          (*((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])
                    (copy.ptr,0,entry.name.content.size_,0);
          Own<const_kj::File,_std::nullptr_t>::operator=
                    ((Own<const_kj::File,_std::nullptr_t> *)&entry,&copy);
          Own<const_kj::File,_std::nullptr_t>::dispose(&copy);
          pAVar6 = (ArrayDisposer *)entry.name.content.size_;
        }
        entry.name.content.size_ = 0;
        argValues[0].content.ptr = entry.name.content.ptr;
        copy.disposer = (Disposer *)CONCAT44(copy.disposer._4_4_,1);
        copy.ptr = (File *)entry.name.content.ptr;
        argValues[0].content.size_ = 0;
        EStack_178.name.content.ptr = (char *)pAVar6;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&copy);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)&copy);
        Own<const_kj::File,_std::nullptr_t>::dispose
                  ((Own<const_kj::File,_std::nullptr_t> *)argValues);
      }
      Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&entry);
LAB_001d6262:
      if (sVar10 != 0) {
LAB_001d6270:
        copy.ptr = (File *)0x0;
        EStack_178.name.content.ptr = " != ";
        EStack_178.name.content.size_ = 5;
        EStack_178.name.content.disposer._0_1_ = newNode.tag != 0;
        if (newNode.tag == 0) {
          f.exception = (Exception *)0x0;
          local_50 = "(can\'t stringify)";
          local_48 = 0x12;
          copy.disposer = (Disposer *)&newNode;
          local_40 = (ArrayPtr<const_char>)toCharSequence<decltype(nullptr)&>(&copy.ptr);
          kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
                    (&entry.name,(_ *)&local_50,(StringPtr *)&EStack_178,(StringPtr *)&local_40,
                     (StringPtr *)in_R8);
          argValues[0].content.ptr = entry.name.content.ptr;
          argValues[0].content.size_ = entry.name.content.size_;
          argValues[0].content.disposer = entry.name.content.disposer;
          entry.name.content.ptr = (char *)0x0;
          entry.name.content.size_ = 0;
          Array<char>::~Array((Array<char> *)&entry);
          entry.name.content.ptr = (char *)argValues;
          entry.name.content.size_ = 1;
          kj::_::Debug::Fault::init
                    (&f,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                    );
          Array<char>::~Array(&argValues[0].content);
          kj::_::Debug::Fault::fatal(&f);
        }
        entry.name.content.ptr = ((filename.parts.ptr)->content).ptr;
        entry.name.content.size_ = ((filename.parts.ptr)->content).size_;
        EStack_178.name.content.ptr = (char *)((filename.parts.ptr)->content).disposer;
        ((filename.parts.ptr)->content).ptr = (char *)0x0;
        ((filename.parts.ptr)->content).size_ = 0;
        copy.disposer = (Disposer *)0x0;
        copy.ptr = (File *)0x0;
        entry.node._0_8_ = entry.node._0_8_ & 0xffffffff00000000;
        entry.name.content.disposer = (ArrayDisposer *)EStack_178.name.content.ptr;
        Array<char>::~Array((Array<char> *)&copy);
        sVar10 = entry.name.content.size_;
        pDVar11 = (Disposer *)entry.name.content.ptr;
        EntryImpl::init(&entry,(EVP_PKEY_CTX *)&newNode);
        copy.ptr = (File *)(sVar10 + (sVar10 == 0));
        if (sVar10 == 0) {
          pDVar11 = (Disposer *)0x20b013;
        }
        copy.disposer = pDVar11;
        EntryImpl::EntryImpl(&EStack_178,&entry);
        _Var12 = std::
                 map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                 ::
                 insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                           ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                             *)(pIVar4 + 0x40),
                            (pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                             *)&copy);
        argValues[0].content.ptr = (char *)CONCAT71(argValues[0].content.ptr._1_7_,_Var12.second);
        EntryImpl::~EntryImpl(&EStack_178);
        if (((undefined1  [16])_Var12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&copy,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x63c,FAILED,"entries.insert(std::make_pair(nameRef, kj::mv(entry))).second",
                     "_kjCondition,",(DebugExpression<bool> *)argValues);
          kj::_::Debug::Fault::fatal((Fault *)&copy);
        }
        EntryImpl::~EntryImpl(&entry);
      }
    }
    else {
      if (TVar1 == DIRECTORY) {
        in_R8 = (char *)0x2;
        (**(code **)(*plVar7 + 0x88))
                  ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    *)&copy,plVar7,filename.parts.ptr,filename.parts.size_);
        entry.name.content.ptr = (char *)copy.disposer;
        entry.name.content.size_ = (size_t)copy.ptr;
        copy.ptr = (File *)0x0;
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&copy);
        sVar10 = entry.name.content.size_;
        if (entry.name.content.size_ != 0) {
          copyDirectory((Impl *)&copy,(Directory *)(pIVar4 + 0x30),SUB81(entry.name.content.size_,0)
                       );
          Own<const_kj::Directory,_std::nullptr_t>::operator=
                    ((Own<const_kj::Directory,_std::nullptr_t> *)&entry,
                     (Own<const_kj::Directory,_std::nullptr_t> *)&copy);
          Own<const_kj::Directory,_std::nullptr_t>::dispose
                    ((Own<const_kj::Directory,_std::nullptr_t> *)&copy);
          EStack_178.name.content.ptr = (char *)entry.name.content.size_;
          entry.name.content.size_ = 0;
          argValues[0].content.ptr = entry.name.content.ptr;
          copy.disposer = (Disposer *)CONCAT44(copy.disposer._4_4_,2);
          copy.ptr = (File *)entry.name.content.ptr;
          argValues[0].content.size_ = 0;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                                *)&copy);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    *)&copy);
          Own<const_kj::Directory,_std::nullptr_t>::dispose
                    ((Own<const_kj::Directory,_std::nullptr_t> *)argValues);
        }
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&entry);
        goto LAB_001d6262;
      }
      if (TVar1 == SYMLINK) {
        (**(code **)(*plVar7 + 0x60))
                  ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    *)&copy,plVar7,filename.parts.ptr,filename.parts.size_);
        entry.name.content.ptr = (char *)CONCAT71(entry.name.content.ptr._1_7_,(char)copy.disposer);
        if ((char)copy.disposer == '\x01') {
          entry.name.content.size_ = (size_t)copy.ptr;
          entry.name.content.disposer = (ArrayDisposer *)EStack_178.name.content.ptr;
          entry.node._0_8_ = EStack_178.name.content.size_;
          copy.ptr = (File *)0x0;
          EStack_178.name.content.ptr = (char *)0x0;
        }
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&copy);
        if ((char)entry.name.content.ptr != '\x01') {
LAB_001d6408:
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&entry);
          goto LAB_001d6415;
        }
        (**(code **)(*plVar7 + 0x48))
                  ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    *)&copy,plVar7,filename.parts.ptr,filename.parts.size_);
        if ((char)copy.disposer != '\x01') goto LAB_001d6408;
        argValues[0].content.ptr =
             (char *)CONCAT71(EStack_178.name.content.disposer._1_7_,
                              EStack_178.name.content.disposer._0_1_);
        argValues[0].content.size_ = entry.name.content.size_;
        argValues[0].content.disposer = entry.name.content.disposer;
        entry.name.content.size_ = 0;
        entry.name.content.disposer = (ArrayDisposer *)0x0;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode,int>
                  ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    *)&copy,(SymlinkNode *)argValues);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&copy);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)&copy);
        Array<char>::~Array((Array<char> *)&argValues[0].content.size_);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&entry);
        goto LAB_001d6270;
      }
      if (kj::_::Debug::minSeverity < 3) {
        in_R8 = "couldn\'t copy node of type not supported by InMemoryDirectory";
        kj::_::Debug::log<char_const(&)[62],kj::Path&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x633,ERROR,
                   "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename",
                   (char (*) [62])"couldn\'t copy node of type not supported by InMemoryDirectory",
                   &filename);
      }
    }
LAB_001d6415:
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::~OneOf(&newNode);
    Array<kj::String>::~Array(&filename.parts);
    pEVar8 = pEVar8 + 1;
    lVar9 = lVar9 + -0x20;
  } while( true );
}

Assistant:

Own<const Directory> copyDirectory(const Directory& other, bool copyFiles) const {
      // Creates an in-memory deep copy of the given directory object. If `copyFiles` is true, then
      // file contents are copied too, otherwise they are just linked.
      return kj::atomicRefcounted<InMemoryDirectory>(clock, fileFactory, other, copyFiles);
    }